

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O0

char * IoTHubClient_Auth_Get_SasToken
                 (IOTHUB_AUTHORIZATION_HANDLE handle,char *scope,
                 uint64_t expiry_time_relative_seconds,char *key_name)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *source;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  uint64_t expiry_time_1;
  LOGGER_LOG l_7;
  uint64_t sec_since_epoch_1;
  STRING_HANDLE sas_token;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  CREDENTIAL_RESULT *cred_result;
  uint64_t expiry_time;
  LOGGER_LOG l_1;
  uint64_t sec_since_epoch;
  DEVICE_AUTH_CREDENTIAL_INFO dev_auth_cred;
  LOGGER_LOG l;
  char *result;
  char *key_name_local;
  uint64_t expiry_time_relative_seconds_local;
  char *scope_local;
  IOTHUB_AUTHORIZATION_HANDLE handle_local;
  
  result = key_name;
  key_name_local = (char *)expiry_time_relative_seconds;
  expiry_time_relative_seconds_local = (uint64_t)scope;
  scope_local = (char *)handle;
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    dev_auth_cred.sas_info.key_name = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)dev_auth_cred.sas_info.key_name != (LOGGER_LOG)0x0) {
      (*(code *)dev_auth_cred.sas_info.key_name)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                 ,"IoTHubClient_Auth_Get_SasToken",0x179,1,"Invalid Parameter handle: %p",
                 scope_local);
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH) {
    iVar1 = get_seconds_since_epoch((uint64_t *)&l_1);
    if (iVar1 == 0) {
      memset(&sec_since_epoch,0,0x20);
      cred_result = (CREDENTIAL_RESULT *)(l_1 + *(long *)(scope_local + 0x20));
      if (cred_result < l_1) {
        cred_result = (CREDENTIAL_RESULT *)0xffffffffffffffff;
      }
      dev_auth_cred._0_8_ = cred_result;
      dev_auth_cred.sas_info.expiry_seconds = expiry_time_relative_seconds_local;
      dev_auth_cred.sas_info.token_scope = result;
      sec_since_epoch._0_4_ = 1;
      l_2 = (LOGGER_LOG)
            iothub_device_auth_generate_credentials
                      (*(IOTHUB_SECURITY_HANDLE *)(scope_local + 0x30),
                       (DEVICE_AUTH_CREDENTIAL_INFO *)&sec_since_epoch);
      if ((CREDENTIAL_RESULT *)l_2 == (CREDENTIAL_RESULT *)0x0) {
        l_3 = xlogging_get_log_function();
        if (l_3 != (LOGGER_LOG)0x0) {
          (*l_3)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                 ,"IoTHubClient_Auth_Get_SasToken",0x199,1,
                 "failure getting credentials from device auth module");
        }
        l = (LOGGER_LOG)0x0;
      }
      else {
        iVar1 = mallocAndStrcpy_s((char **)&l,
                                  (((CREDENTIAL_RESULT *)l_2)->auth_cred_result).x509_result.
                                  x509_cert);
        if (iVar1 != 0) {
          l_4 = xlogging_get_log_function();
          if (l_4 != (LOGGER_LOG)0x0) {
            (*l_4)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                   ,"IoTHubClient_Auth_Get_SasToken",0x1a0,1,"failure allocating Sas Token");
          }
          l = (LOGGER_LOG)0x0;
        }
        free(l_2);
      }
    }
    else {
      expiry_time = (uint64_t)xlogging_get_log_function();
      if ((LOGGER_LOG)expiry_time != (LOGGER_LOG)0x0) {
        (*(code *)expiry_time)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                   ,"IoTHubClient_Auth_Get_SasToken",0x186,1,"failure getting seconds from epoch");
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) {
    if (handle->device_sas_token == (char *)0x0) {
      l_6 = xlogging_get_log_function();
      if (l_6 != (LOGGER_LOG)0x0) {
        (*l_6)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
               ,"IoTHubClient_Auth_Get_SasToken",0x1b7,1,"failure device sas token is NULL");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      iVar1 = mallocAndStrcpy_s((char **)&l,handle->device_sas_token);
      if (iVar1 != 0) {
        l_5 = xlogging_get_log_function();
        if (l_5 != (LOGGER_LOG)0x0) {
          (*l_5)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                 ,"IoTHubClient_Auth_Get_SasToken",0x1b1,1,"failure allocating sas token");
        }
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
    if (scope == (char *)0x0) {
      sas_token = (STRING_HANDLE)xlogging_get_log_function();
      if (sas_token != (STRING_HANDLE)0x0) {
        (*(code *)sas_token)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                   ,"IoTHubClient_Auth_Get_SasToken",0x1bf,1,"Invalid Parameter scope: %p",
                   expiry_time_relative_seconds_local);
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      iVar1 = get_seconds_since_epoch((uint64_t *)&l_7);
      if (iVar1 == 0) {
        l_8 = l_7 + *(long *)(scope_local + 0x20);
        if (l_8 < l_7) {
          l_8 = (LOGGER_LOG)0xffffffffffffffff;
        }
        sec_since_epoch_1 =
             (uint64_t)
             SASToken_CreateString
                       (*(char **)(scope_local + 8),(char *)expiry_time_relative_seconds_local,
                        result,(uint64_t)l_8);
        if ((STRING_HANDLE)sec_since_epoch_1 == (STRING_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                      ,"IoTHubClient_Auth_Get_SasToken",0x1d6,1,"Failed creating sas_token");
          }
          l = (LOGGER_LOG)0x0;
        }
        else {
          source = STRING_c_str((STRING_HANDLE)sec_since_epoch_1);
          iVar1 = mallocAndStrcpy_s((char **)&l,source);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                        ,"IoTHubClient_Auth_Get_SasToken",0x1dd,1,"Failed copying result");
            }
            l = (LOGGER_LOG)0x0;
          }
          STRING_delete((STRING_HANDLE)sec_since_epoch_1);
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                    ,"IoTHubClient_Auth_Get_SasToken",0x1c9,1,"failure getting seconds from epoch");
        }
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_Get_SasToken",0x1e7,1,
                "Failed getting sas token invalid credential type");
    }
    l = (LOGGER_LOG)0x0;
  }
  return (char *)l;
}

Assistant:

char* IoTHubClient_Auth_Get_SasToken(IOTHUB_AUTHORIZATION_HANDLE handle, const char* scope, uint64_t expiry_time_relative_seconds, const char* key_name)
{
    char* result;
    (void)expiry_time_relative_seconds;
    if (handle == NULL)
    {
        LogError("Invalid Parameter handle: %p", handle);
        result = NULL;
    }
    else
    {
        if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH)
        {
#ifdef USE_PROV_MODULE
            DEVICE_AUTH_CREDENTIAL_INFO dev_auth_cred;
            uint64_t sec_since_epoch;

            if (get_seconds_since_epoch(&sec_since_epoch) != 0)
            {
                LogError("failure getting seconds from epoch");
                result = NULL;
            }
            else
            {
                memset(&dev_auth_cred, 0, sizeof(DEVICE_AUTH_CREDENTIAL_INFO));
                uint64_t expiry_time = sec_since_epoch + handle->token_expiry_time_sec;
                if (expiry_time < sec_since_epoch)
                {
                    expiry_time = UINT64_MAX;
                }
                dev_auth_cred.sas_info.expiry_seconds = expiry_time;
                dev_auth_cred.sas_info.token_scope = scope;
                dev_auth_cred.sas_info.key_name = key_name;
                dev_auth_cred.dev_auth_type = AUTH_TYPE_SAS;

                CREDENTIAL_RESULT* cred_result = iothub_device_auth_generate_credentials(handle->device_auth_handle, &dev_auth_cred);
                if (cred_result == NULL)
                {
                    LogError("failure getting credentials from device auth module");
                    result = NULL;
                }
                else
                {
                    if (mallocAndStrcpy_s(&result, cred_result->auth_cred_result.sas_result.sas_token) != 0)
                    {
                        LogError("failure allocating Sas Token");
                        result = NULL;
                    }
                    free(cred_result);
                }
            }
#else
            LogError("Failed HSM module is not supported");
            result = NULL;
#endif
        }
        else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN)
        {
            if (handle->device_sas_token != NULL)
            {
                if (mallocAndStrcpy_s(&result, handle->device_sas_token) != 0)
                {
                    LogError("failure allocating sas token");
                    result = NULL;
                }
            }
            else
            {
                LogError("failure device sas token is NULL");
                result = NULL;
            }
        }
        else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY)
        {
            if (scope == NULL)
            {
                LogError("Invalid Parameter scope: %p", scope);
                result = NULL;
            }
            else
            {
                STRING_HANDLE sas_token;
                uint64_t sec_since_epoch;

                if (get_seconds_since_epoch(&sec_since_epoch) != 0)
                {
                    LogError("failure getting seconds from epoch");
                    result = NULL;
                }
                else
                {
                    uint64_t expiry_time = sec_since_epoch + handle->token_expiry_time_sec;
                    if (expiry_time < sec_since_epoch)
                    {
                        expiry_time = UINT64_MAX;
                    }

                    if ( (sas_token = SASToken_CreateString(handle->device_key, scope, key_name, expiry_time)) == NULL)
                    {
                        LogError("Failed creating sas_token");
                        result = NULL;
                    }
                    else
                    {
                        if (mallocAndStrcpy_s(&result, STRING_c_str(sas_token) ) != 0)
                        {
                            LogError("Failed copying result");
                            result = NULL;
                        }
                        STRING_delete(sas_token);
                    }
                }
            }
        }
        else
        {
            LogError("Failed getting sas token invalid credential type");
            result = NULL;
        }
    }
    return result;
}